

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O3

void __thiscall
Diligent::BufferBase<Diligent::EngineGLImplTraits>::CreateDefaultViews
          (BufferBase<Diligent::EngineGLImplTraits> *this)

{
  BufferViewGLImpl *pBVar1;
  BufferViewImplType *pBVar2;
  anon_class_8_1_8991fb9c CreateDefaultView;
  anon_class_8_1_8991fb9c local_10;
  
  local_10.this = this;
  if ((((this->
        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
        ).m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != BIND_NONE) &&
     (((this->
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       ).m_Desc.Mode & ~BUFFER_MODE_FORMATTED) == BUFFER_MODE_STRUCTURED)) {
    pBVar2 = CreateDefaultViews::anon_class_8_1_8991fb9c::operator()
                       (&local_10,BUFFER_VIEW_UNORDERED_ACCESS);
    pBVar1 = (this->m_pDefaultUAV)._M_t.
             super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
             ._M_t.
             super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
             .super__Head_base<0UL,_Diligent::BufferViewGLImpl_*,_false>._M_head_impl;
    (this->m_pDefaultUAV)._M_t.
    super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
    .super__Head_base<0UL,_Diligent::BufferViewGLImpl_*,_false>._M_head_impl = pBVar2;
    if (pBVar1 != (BufferViewGLImpl *)0x0) {
      STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::operator()
                ((STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator> *)
                 &this->m_pDefaultUAV,pBVar1);
    }
  }
  if ((((this->
        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
        ).m_Desc.BindFlags & BIND_SHADER_RESOURCE) != BIND_NONE) &&
     (((this->
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       ).m_Desc.Mode & ~BUFFER_MODE_FORMATTED) == BUFFER_MODE_STRUCTURED)) {
    pBVar2 = CreateDefaultViews::anon_class_8_1_8991fb9c::operator()
                       (&local_10,BUFFER_VIEW_SHADER_RESOURCE);
    pBVar1 = (this->m_pDefaultSRV)._M_t.
             super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
             ._M_t.
             super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
             .super__Head_base<0UL,_Diligent::BufferViewGLImpl_*,_false>._M_head_impl;
    (this->m_pDefaultSRV)._M_t.
    super___uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_Diligent::BufferViewGLImpl_*,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
    .super__Head_base<0UL,_Diligent::BufferViewGLImpl_*,_false>._M_head_impl = pBVar2;
    if (pBVar1 != (BufferViewGLImpl *)0x0) {
      STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::operator()
                ((STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator> *)
                 &this->m_pDefaultSRV,pBVar1);
    }
  }
  return;
}

Assistant:

void CreateDefaultViews()
    {
        // Create default views for structured and raw buffers. For formatted buffers we do not know the view format, so
        // cannot create views.

        auto CreateDefaultView = [&](BUFFER_VIEW_TYPE ViewType) //
        {
            BufferViewDesc ViewDesc;
            ViewDesc.ViewType = ViewType;

            std::string ViewName;
            switch (ViewType)
            {
                case BUFFER_VIEW_UNORDERED_ACCESS:
                    ViewName = "Default UAV of buffer '";
                    break;

                case BUFFER_VIEW_SHADER_RESOURCE:
                    ViewName = "Default SRV of buffer '";
                    break;

                default:
                    UNEXPECTED("Unexpected buffer view type");
            }

            ViewName += this->m_Desc.Name;
            ViewName += '\'';
            ViewDesc.Name = ViewName.c_str();

            IBufferView* pView = nullptr;
            CreateViewInternal(ViewDesc, &pView, true);
            VERIFY(pView != nullptr, "Failed to create default view for buffer '", this->m_Desc.Name, "'");
            VERIFY(pView->GetDesc().ViewType == ViewType, "Unexpected view type");

            return static_cast<BufferViewImplType*>(pView);
        };

        if (this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS && (this->m_Desc.Mode == BUFFER_MODE_STRUCTURED || this->m_Desc.Mode == BUFFER_MODE_RAW))
        {
            m_pDefaultUAV.reset(CreateDefaultView(BUFFER_VIEW_UNORDERED_ACCESS));
        }

        if (this->m_Desc.BindFlags & BIND_SHADER_RESOURCE && (this->m_Desc.Mode == BUFFER_MODE_STRUCTURED || this->m_Desc.Mode == BUFFER_MODE_RAW))
        {
            m_pDefaultSRV.reset(CreateDefaultView(BUFFER_VIEW_SHADER_RESOURCE));
        }
    }